

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O3

int run_loop(int fd,quicly_conn_t *client)

{
  unsigned_long *packet;
  _func_int64_t_st_quicly_now_t_ptr *p_Var1;
  quicly_sendbuf_t *sb;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  int64_t iVar5;
  int *piVar6;
  ulong datagram_size;
  quicly_stream_t *stream;
  ssize_t sVar7;
  size_t sVar8;
  quicly_conn_t **ppqVar9;
  undefined1 *puVar10;
  quicly_conn_t *pqVar11;
  undefined1 *buf_00;
  long lVar12;
  long lVar13;
  uint8_t *puVar14;
  undefined1 local_1a48 [8];
  uint8_t buf [4096];
  quicly_conn_t *conns [256];
  undefined1 local_240 [8];
  sockaddr_storage sa;
  undefined1 auStack_138 [8];
  fd_set readfds;
  quicly_address_t src;
  timeval local_80;
  undefined1 *local_70;
  size_t local_68;
  size_t off;
  long local_58;
  quicly_conn_t *local_50;
  uint8_t *local_48;
  iovec vec;
  
  puVar10 = local_1a48;
  memset(buf + 0xff8,0,0x800);
  vec.iov_len._4_4_ = (uint)(client != (quicly_conn_t *)0x0);
  iVar2 = fd + 0x3f;
  if (-1 < fd) {
    iVar2 = fd;
  }
  off = 1L << ((byte)fd & 0x3f);
  local_58 = (long)(iVar2 >> 6);
  vec.iov_len._0_4_ = fd + 1;
  packet = &sa.__ss_align;
  buf._4088_8_ = client;
  local_50 = client;
LAB_001165af:
  p_Var1 = (ctx.now)->cb;
  *(undefined8 *)(puVar10 + -8) = 0x1165b8;
  iVar4 = (*p_Var1)(ctx.now);
  lVar12 = 0x7fffffffffffffff;
  if (buf._4088_8_ != 0) {
    ppqVar9 = conns;
    pqVar11 = (quicly_conn_t *)buf._4088_8_;
    do {
      *(undefined8 *)(puVar10 + -8) = 0x1165dd;
      iVar5 = quicly_get_first_timeout(pqVar11);
      if (iVar5 < lVar12) {
        lVar12 = iVar5;
      }
      pqVar11 = *ppqVar9;
      ppqVar9 = ppqVar9 + 1;
    } while (pqVar11 != (quicly_conn_t *)0x0);
  }
  lVar13 = lVar12 - iVar4;
  if (lVar13 == 0 || lVar12 < iVar4) {
    local_80.tv_sec = 1000;
    lVar12 = 0;
  }
  else {
    if (999999 < lVar13) {
      lVar13 = 1000000;
    }
    local_80.tv_sec = lVar13 / 1000;
    lVar12 = (lVar13 % 1000) * 1000;
  }
  auStack_138 = (undefined1  [8])0x0;
  readfds.fds_bits[0] = 0;
  readfds.fds_bits[1] = 0;
  readfds.fds_bits[2] = 0;
  readfds.fds_bits[3] = 0;
  readfds.fds_bits[4] = 0;
  readfds.fds_bits[5] = 0;
  readfds.fds_bits[6] = 0;
  readfds.fds_bits[7] = 0;
  readfds.fds_bits[8] = 0;
  readfds.fds_bits[9] = 0;
  readfds.fds_bits[10] = 0;
  readfds.fds_bits[0xb] = 0;
  readfds.fds_bits[0xc] = 0;
  readfds.fds_bits[0xd] = 0;
  readfds.fds_bits[0xe] = 0;
  readfds.fds_bits[local_58 + -1] = readfds.fds_bits[local_58 + -1] | off;
  if (vec.iov_len._4_4_ != 0) {
    auStack_138 = (undefined1  [8])((ulong)auStack_138 | 1);
  }
  *(undefined8 *)(puVar10 + -8) = 0x1166b3;
  local_80.tv_usec = lVar12;
  iVar2 = select((int)vec.iov_len,(fd_set *)auStack_138,(fd_set *)0x0,(fd_set *)0x0,&local_80);
  if (iVar2 == -1) goto code_r0x001166b8;
  goto LAB_001166c6;
code_r0x001166b8:
  *(undefined8 *)(puVar10 + -8) = 0x1166bd;
  piVar6 = __errno_location();
  if (*piVar6 == 4) goto LAB_001165af;
LAB_001166c6:
  if ((readfds.fds_bits[local_58 + -1] & off) != 0) {
    local_48 = local_1a48;
    vec.iov_base = (void *)0x1000;
    readfds.fds_bits[0xf] = (__fd_mask)local_240;
    do {
      *(undefined8 *)(puVar10 + -8) = 0x116742;
      datagram_size = recvmsg(fd,(msghdr *)(readfds.fds_bits + 0xf),0);
      if (datagram_size != 0xffffffffffffffff) {
        if (0 < (long)datagram_size) {
          local_68 = 0;
          goto LAB_0011676b;
        }
        break;
      }
      *(undefined8 *)(puVar10 + -8) = 0x11674d;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
  }
LAB_00116838:
  if (((ulong)auStack_138 & 1) != 0) {
    if (local_50 == (quicly_conn_t *)0x0) {
      *(code **)(puVar10 + -8) = quicly_streambuf_egress_shift;
      __assert_fail("client != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/examples/echo.c"
                    ,0xf3,"int run_loop(int, quicly_conn_t *)");
    }
    *(undefined8 *)(puVar10 + -8) = 0x116855;
    stream = quicly_get_stream(local_50,0);
    if ((stream == (quicly_stream_t *)0x0) || ((stream->sendstate).final_size != 0xffffffffffffffff)
       ) {
LAB_00116868:
      vec.iov_len._4_4_ = 0;
    }
    else {
      do {
        *(undefined8 *)(puVar10 + -8) = 0x1169f8;
        sVar8 = read(0,local_1a48,0x1000);
        if (sVar8 != 0xffffffffffffffff) {
          if (sVar8 == 0) {
            *(undefined8 *)(puVar10 + -8) = 0x116a1a;
            quicly_streambuf_egress_shutdown(stream);
            goto LAB_00116868;
          }
          break;
        }
        *(undefined8 *)(puVar10 + -8) = 0x116a06;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      sb = (quicly_sendbuf_t *)stream->data;
      *(undefined8 *)(puVar10 + -8) = 0x116a39;
      quicly_sendbuf_write(stream,sb,local_1a48,sVar8);
    }
  }
  if (buf._4088_8_ != 0) {
    ppqVar9 = (quicly_conn_t **)(buf + 0xff8);
    lVar12 = 0;
    do {
      buf_00 = puVar10 + -(ctx.transport_params.max_udp_payload_size * 10 + 0xf & 0xfffffffffffffff0
                          );
      local_48 = (uint8_t *)0xa;
      pqVar11 = conns[lVar12 + -1];
      *(uint64_t *)(buf_00 + -0x10) = ctx.transport_params.max_udp_payload_size * 10;
      *(undefined8 *)(buf_00 + -0x18) = 0x1168e1;
      uVar3 = quicly_send(pqVar11,(quicly_address_t *)local_240,
                          (quicly_address_t *)(readfds.fds_bits + 0xf),(iovec *)local_1a48,
                          (size_t *)&local_48,buf_00,*(size_t *)(buf_00 + -0x10));
      if (uVar3 == 0xff03) {
        pqVar11 = *ppqVar9;
        *(undefined8 *)(buf_00 + -8) = 0x11698e;
        quicly_free(pqVar11);
        *(undefined8 *)(buf_00 + -8) = 0x1169b9;
        memmove(conns + lVar12 + -1,conns + lVar12,lVar12 * -8 + 0x7f8);
        if (((ctx.tls)->certificates).count == 0) {
          return 0;
        }
      }
      else {
        if (uVar3 != 0) {
          *(undefined8 *)(buf_00 + -8) = 0x116a69;
          fprintf(_stderr,"quicly_send returned %d\n",(ulong)uVar3);
          return 1;
        }
        local_70 = puVar10;
        if (local_48 != (uint8_t *)0x0) {
          puVar14 = (uint8_t *)0x0;
          do {
            sa.__ss_align = (unsigned_long)local_240;
            *(undefined8 *)(buf_00 + -8) = 0x11692b;
            quicly_get_socklen((sockaddr *)sa.__ss_align);
            do {
              *(undefined8 *)(buf_00 + -8) = 0x116964;
              sVar7 = sendmsg(fd,(msghdr *)packet,0);
              if ((int)sVar7 != -1) break;
              *(undefined8 *)(buf_00 + -8) = 0x11696e;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            puVar14 = puVar14 + 1;
          } while (puVar14 != local_48);
        }
        lVar12 = lVar12 + 1;
        puVar10 = local_70;
      }
      ppqVar9 = conns + lVar12 + -1;
    } while (*ppqVar9 != (quicly_conn_t *)0x0);
  }
  goto LAB_001165af;
LAB_0011676b:
  do {
    *(undefined8 *)(puVar10 + -8) = 0x11678b;
    sVar8 = quicly_decode_packet
                      (&ctx,(quicly_decoded_packet_t *)packet,local_48,datagram_size,&local_68);
    if (sVar8 == 0xffffffffffffffff) break;
    if (buf._4088_8_ == 0) {
      lVar12 = 0;
    }
    else {
      ppqVar9 = (quicly_conn_t **)(buf + 0xff8);
      lVar12 = 0;
      pqVar11 = (quicly_conn_t *)buf._4088_8_;
      do {
        *(undefined8 *)(puVar10 + -8) = 0x1167bb;
        iVar2 = quicly_is_destination
                          (pqVar11,(sockaddr *)0x0,(sockaddr *)readfds.fds_bits[0xf],
                           (quicly_decoded_packet_t *)packet);
        if (iVar2 != 0) {
          pqVar11 = *ppqVar9;
          if (pqVar11 == (quicly_conn_t *)0x0) goto LAB_001167df;
          *(undefined8 *)(puVar10 + -8) = 0x11682e;
          quicly_receive(pqVar11,(sockaddr *)0x0,(sockaddr *)readfds.fds_bits[0xf],
                         (quicly_decoded_packet_t *)packet);
          goto LAB_0011682e;
        }
        lVar12 = lVar12 + 1;
        pqVar11 = ppqVar9[1];
        ppqVar9 = ppqVar9 + 1;
      } while (pqVar11 != (quicly_conn_t *)0x0);
    }
    ppqVar9 = conns + lVar12 + -1;
LAB_001167df:
    if (local_50 == (quicly_conn_t *)0x0) {
      *(undefined8 *)(puVar10 + -8) = 0;
      *(quicly_cid_plaintext_t **)(puVar10 + -0x10) = &next_cid;
      *(undefined8 *)(puVar10 + -0x18) = 0x11680e;
      quicly_accept(ppqVar9,&ctx,(sockaddr *)0x0,(sockaddr *)readfds.fds_bits[0xf],
                    (quicly_decoded_packet_t *)packet,(quicly_address_token_plaintext_t *)0x0,
                    *(quicly_cid_plaintext_t **)(puVar10 + -0x10),
                    *(ptls_handshake_properties_t **)(puVar10 + -8));
    }
LAB_0011682e:
  } while (local_68 < datagram_size);
  goto LAB_00116838;
}

Assistant:

static int run_loop(int fd, quicly_conn_t *client)
{
    quicly_conn_t *conns[256] = {client}; /* a null-terminated list of connections; proper app should use a hashmap or something */
    size_t i;
    int read_stdin = client != NULL;

    while (1) {

        /* wait for sockets to become readable, or some event in the QUIC stack to fire */
        fd_set readfds;
        struct timeval tv;
        do {
            int64_t first_timeout = INT64_MAX, now = ctx.now->cb(ctx.now);
            for (i = 0; conns[i] != NULL; ++i) {
                int64_t conn_timeout = quicly_get_first_timeout(conns[i]);
                if (conn_timeout < first_timeout)
                    first_timeout = conn_timeout;
            }
            if (now < first_timeout) {
                int64_t delta = first_timeout - now;
                if (delta > 1000 * 1000)
                    delta = 1000 * 1000;
                tv.tv_sec = delta / 1000;
                tv.tv_usec = (delta % 1000) * 1000;
            } else {
                tv.tv_sec = 1000;
                tv.tv_usec = 0;
            }
            FD_ZERO(&readfds);
            FD_SET(fd, &readfds);
            /* we want to read input from stdin */
            if (read_stdin)
                FD_SET(0, &readfds);
        } while (select(fd + 1, &readfds, NULL, NULL, &tv) == -1 && errno == EINTR);

        /* read the QUIC fd */
        if (FD_ISSET(fd, &readfds)) {
            uint8_t buf[4096];
            struct sockaddr_storage sa;
            struct iovec vec = {.iov_base = buf, .iov_len = sizeof(buf)};
            struct msghdr msg = {.msg_name = &sa, .msg_namelen = sizeof(sa), .msg_iov = &vec, .msg_iovlen = 1};
            ssize_t rret;
            while ((rret = recvmsg(fd, &msg, 0)) == -1 && errno == EINTR)
                ;
            if (rret > 0)
                process_msg(client != NULL, conns, &msg, rret);
        }

        /* read stdin, send the input to the active stram */
        if (FD_ISSET(0, &readfds)) {
            assert(client != NULL);
            if (!forward_stdin(client))
                read_stdin = 0;
        }

        /* send QUIC packets, if any */
        for (i = 0; conns[i] != NULL; ++i) {
            quicly_address_t dest, src;
            struct iovec dgrams[10];
            uint8_t dgrams_buf[PTLS_ELEMENTSOF(dgrams) * ctx.transport_params.max_udp_payload_size];
            size_t num_dgrams = PTLS_ELEMENTSOF(dgrams);
            int ret = quicly_send(conns[i], &dest, &src, dgrams, &num_dgrams, dgrams_buf, sizeof(dgrams_buf));
            switch (ret) {
            case 0: {
                size_t j;
                for (j = 0; j != num_dgrams; ++j) {
                    send_one(fd, &dest.sa, &dgrams[j]);
                }
            } break;
            case QUICLY_ERROR_FREE_CONNECTION:
                /* connection has been closed, free, and exit when running as a client */
                quicly_free(conns[i]);
                memmove(conns + i, conns + i + 1, sizeof(conns) - sizeof(conns[0]) * (i + 1));
                --i;
                if (!is_server())
                    return 0;
                break;
            default:
                fprintf(stderr, "quicly_send returned %d\n", ret);
                return 1;
            }
        }
    }

    return 0;
}